

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  ExprList *this_00;
  pointer ppMVar1;
  pointer ppMVar2;
  bool bVar3;
  Result RVar4;
  reference pvVar5;
  ulong uVar6;
  pointer *__ptr;
  Enum EVar7;
  undefined8 uVar8;
  undefined1 local_138 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_128;
  undefined4 uStack_118;
  undefined8 uStack_114;
  _Head_base<0UL,_wabt::MemoryImport_*,_false> local_108;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::MemoryImport_*,_false> local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  string name;
  Location loc;
  ModuleFieldList export_fields;
  Const local_80;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar4 = Expect(this,Memory);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar4 = ParseInlineExports(this,&export_fields,Memory);
  EVar7 = Error;
  if (RVar4.enum_ == Error) goto LAB_001815a2;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::MemoryImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_128.field_0);
    RVar4 = ParseInlineImport(this,(Import *)local_128.field_1.offset);
    uVar8 = local_128.field_1.offset;
    if (((RVar4.enum_ != Error) &&
        (RVar4 = ParseLimitsIndex(this,(Limits *)((long)local_128.field_1.offset + 0x70)),
        uVar8 = local_128.field_1.offset, RVar4.enum_ != Error)) &&
       (RVar4 = ParseLimits(this,(Limits *)((long)local_128.field_1.offset + 0x70)),
       uVar8 = local_128.field_1.offset, RVar4.enum_ != Error)) {
      GetLocation(&local_80.loc,this);
      std::
      make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                 local_138,(Location *)&local_128.field_0);
      local_e0 = (undefined1  [8])local_138._0_8_;
      local_138._0_8_ = (MemoryImport *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)local_e0);
      if (local_e0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_e0 + 8))();
      }
      local_e0 = (undefined1  [8])0x0;
      uVar8 = local_128.field_1.offset;
      if ((_Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>)
          local_138._0_8_ != (MemoryImport *)0x0) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
        uVar8 = local_128.field_1.offset;
      }
      goto LAB_0018155f;
    }
  }
  else {
    std::make_unique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
              ((Location *)local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
    RVar4 = ParseLimitsIndex(this,(Limits *)(local_138._0_8_ + 0x60));
    uVar8 = local_138._0_8_;
    if (RVar4.enum_ != Error) {
      bVar3 = MatchLpar(this,Data);
      if (bVar3) {
        std::make_unique<wabt::DataSegmentModuleField,wabt::Location&>((Location *)(local_138 + 8));
        uVar8 = local_138._8_8_;
        ppMVar1 = (module->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppMVar2 = (module->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        GetLocation((Location *)&local_128.field_0,this);
        Var::Var((Var *)&local_80,(Index)((ulong)((long)ppMVar1 - (long)ppMVar2) >> 3),
                 (Location *)&local_128.field_0);
        Var::operator=(&((DataSegment *)(uVar8 + 0x40))->memory_var,(Var *)&local_80);
        Var::~Var((Var *)&local_80);
        this_00 = &((DataSegment *)(uVar8 + 0x40))->offset;
        if (*(undefined1 *)(local_138._0_8_ + 0x72) == '\x01') {
          uStack_118 = 0;
          uStack_114 = 0;
          local_128.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
          local_128.field_0.last_column = 0;
          local_128._12_4_ = 0;
          Const::I64(&local_80,0,(Location *)&local_128.field_0);
        }
        else {
          uStack_118 = 0;
          uStack_114 = 0;
          local_128.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
          local_128.field_0.last_column = 0;
          local_128._12_4_ = 0;
          Const::I32(&local_80,0,(Location *)&local_128.field_0);
        }
        std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_f0);
        local_f0._8_8_ = local_f0._0_8_;
        local_f0._0_8_ = (long *)0x0;
        intrusive_list<wabt::Expr>::push_back
                  (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                           (local_f0 + 8));
        if ((long *)local_f0._8_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_f0._8_8_ + 8))();
        }
        local_f0._8_8_ = (char *)0x0;
        if ((long *)local_f0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_f0._0_8_ + 8))();
        }
        pvVar5 = intrusive_list<wabt::Expr>::back(this_00);
        (pvVar5->loc).filename._M_len = loc.filename._M_len;
        (pvVar5->loc).filename._M_str = loc.filename._M_str;
        (pvVar5->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
        *(undefined8 *)((long)&(pvVar5->loc).field_1 + 8) = loc.field_1._8_8_;
        ParseTextListOpt(this,&((DataSegment *)(uVar8 + 0x40))->data);
        RVar4 = Expect(this,Rpar);
        if (RVar4.enum_ != Error) {
          uVar6 = (ulong)((*(int *)&(((DataSegment *)(uVar8 + 0x40))->data).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(((DataSegment *)(uVar8 + 0x40))->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 0xffffU >> 0x10);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_138._0_8_ + 0x60))->_M_allocated_capacity = uVar6;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_138._0_8_ + 0x68))->_M_allocated_capacity = uVar6;
          *(undefined1 *)&((Limits *)(local_138._0_8_ + 0x70))->initial = 1;
          local_f8._M_head_impl = (MemoryImport *)local_138._0_8_;
          local_138._0_8_ = (MemoryImport *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_f8);
          if (local_f8._M_head_impl != (MemoryImport *)0x0) {
            (*((local_f8._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.
              _vptr_Import[1])();
          }
          local_f8._M_head_impl = (MemoryImport *)0x0;
          local_100._M_head_impl = (DataSegmentModuleField *)local_138._8_8_;
          local_138._8_8_ = (DataSegmentModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                      *)&local_100);
          if (local_100._M_head_impl != (DataSegmentModuleField *)0x0) {
            (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_100._M_head_impl = (DataSegmentModuleField *)0x0;
        }
        if ((DataSegmentModuleField *)local_138._8_8_ != (DataSegmentModuleField *)0x0) {
          (*(((ModuleFieldMixin<(wabt::ModuleFieldType)8> *)local_138._8_8_)->super_ModuleField).
            _vptr_ModuleField[1])();
        }
        uVar8 = local_138._0_8_;
        if (RVar4.enum_ != Error) {
LAB_0018155f:
          if ((Import *)uVar8 != (Import *)0x0) {
            (**(code **)(*(long *)uVar8 + 8))();
          }
          anon_unknown_1::AppendInlineExportFields
                    (module,&export_fields,
                     (int)((ulong)((long)(module->memories).
                                         super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(module->memories).
                                        super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
          RVar4 = Expect(this,Rpar);
          EVar7 = (Enum)(RVar4.enum_ == Error);
          goto LAB_001815a2;
        }
      }
      else {
        RVar4 = ParseLimits(this,(Limits *)&(((Memory *)(local_138._0_8_ + 0x50))->name).field_2);
        uVar8 = local_138._0_8_;
        if (RVar4.enum_ != Error) {
          local_108._M_head_impl = (MemoryImport *)local_138._0_8_;
          local_138._0_8_ = (MemoryImport *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_108);
          if (local_108._M_head_impl != (MemoryImport *)0x0) {
            (*((local_108._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.
              _vptr_Import[1])();
          }
          local_108._M_head_impl = (MemoryImport *)0x0;
          uVar8 = local_138._0_8_;
          goto LAB_0018155f;
        }
      }
    }
  }
  if ((MemoryImport *)uVar8 != (MemoryImport *)0x0) {
    (*(((MemoryImport *)uVar8)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import._vptr_Import
      [1])();
  }
LAB_001815a2:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar7;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = std::make_unique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size(), GetLocation());
      data_segment.offset.push_back(std::make_unique<ConstExpr>(
          field->memory.page_limits.is_64 ? Const::I64(0) : Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
      uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
      field->memory.page_limits.initial = page_size;
      field->memory.page_limits.max = page_size;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}